

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O1

NodesSeq<dg::dda::RWNode> * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createNode
          (NodesSeq<dg::dda::RWNode> *__return_storage_ptr__,LLVMReadWriteGraphBuilder *this,
          Value *v)

{
  uint uVar1;
  Value VVar2;
  LLVMDataDependenceAnalysisOptions *pLVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  RWNodeType t;
  undefined1 auVar9 [16];
  key_type local_68;
  RWNode *local_40;
  _Base_ptr local_38;
  
  if (v[0x10] == (Value)0x3) {
    t = GLOBAL;
LAB_001112d2:
    local_40 = ReadWriteGraph::create(&this->graph,t);
    goto LAB_001112d7;
  }
  if (v == (Value *)0x0 || (byte)v[0x10] < 0x1b) goto switchD_0011133f_caseD_3d;
  VVar2 = v[0x10];
  switch(VVar2) {
  case (Value)0x3a:
    local_40 = createAlloc(this,(Instruction *)v);
    break;
  case (Value)0x3b:
    if (this->buildUses != true) goto switchD_0011133f_caseD_3d;
    local_40 = createLoad(this,(Instruction *)v);
    break;
  case (Value)0x3c:
    local_40 = createStore(this,(Instruction *)v);
    break;
  case (Value)0x3d:
  case (Value)0x3e:
  case (Value)0x3f:
    goto switchD_0011133f_caseD_3d;
  case (Value)0x40:
    local_40 = createAtomicRMW(this,(Instruction *)v);
    break;
  default:
    if (VVar2 == (Value)0x1c) {
      t = RETURN;
      goto LAB_001112d2;
    }
    if (VVar2 == (Value)0x53) {
      pLVar3 = this->_options;
      bVar4 = llvm::IntrinsicInst::classof((CallInst *)v);
      if ((!bVar4) || (*(int *)(*(long *)(v + -0x20) + 0x24) != 0x3a)) {
        lVar5 = llvm::Value::stripPointerCasts();
        if ((lVar5 == 0) ||
           ((*(char *)(lVar5 + 0x10) != '\0' || (*(long *)(lVar5 + 0x48) != lVar5 + 0x48)))) {
LAB_0011151b:
          createCall(__return_storage_ptr__,this,(Instruction *)v);
          return __return_storage_ptr__;
        }
        auVar9 = llvm::Value::getName();
        lVar6 = auVar9._0_8_;
        if (lVar6 == 0) {
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          local_68._M_string_length = 0;
          local_68.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,lVar6,auVar9._8_8_ + lVar6);
        }
        cVar7 = std::
                _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>_>
                ::find((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>_>
                        *)(pLVar3 + 0x68),&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          local_38 = cVar7._M_node;
          operator_delete(local_68._M_dataplus._M_p,
                          CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                   local_68.field_2._M_local_buf[0]) + 1);
          cVar7._M_node = local_38;
        }
        if (cVar7._M_node != (_Base_ptr)(pLVar3 + 0x70)) goto LAB_0011151b;
        auVar9 = llvm::Value::getName();
        lVar6 = auVar9._0_8_;
        if (lVar6 == 0) {
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          local_68._M_string_length = 0;
          local_68.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,lVar6,auVar9._8_8_ + lVar6);
        }
        cVar8 = std::
                _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
                ::find((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
                        *)(pLVar3 + 0x28),&local_68);
        if (cVar8._M_node == (_Base_ptr)(pLVar3 + 0x30)) {
          bVar4 = false;
        }
        else {
          bVar4 = cVar8._M_node[2]._M_color != _S_red;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,
                          CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                   local_68.field_2._M_local_buf[0]) + 1);
        }
        if ((bVar4) || ((*(byte *)(lVar5 + 0x21) & 0x20) == 0)) goto LAB_0011151b;
        uVar1 = *(int *)(lVar5 + 0x24) - 0xbf;
        if (((uVar1 < 6) && ((0x29U >> (uVar1 & 0x1f) & 1) != 0)) ||
           (*(int *)(lVar5 + 0x24) == 0x134)) goto LAB_0011151b;
      }
    }
    goto switchD_0011133f_caseD_3d;
  }
LAB_001112d7:
  local_68._M_dataplus._M_p = (pointer)&local_40;
  local_68._M_string_length = 1;
LAB_0011130a:
  NodesSeq<dg::dda::RWNode>::NodesSeq
            (__return_storage_ptr__,(initializer_list<dg::dda::RWNode_*> *)&local_68);
  return __return_storage_ptr__;
switchD_0011133f_caseD_3d:
  local_68._M_dataplus._M_p = (pointer)0x0;
  local_68._M_string_length = 0;
  goto LAB_0011130a;
}

Assistant:

NodesSeq<RWNode> LLVMReadWriteGraphBuilder::createNode(const llvm::Value *v) {
    using namespace llvm;
    if (isa<GlobalVariable>(v)) {
        // global variables are like allocations
        return {&create(RWNodeType::GLOBAL)};
    }

    const auto *I = dyn_cast<Instruction>(v);
    if (!I)
        return {};

    // we may created this node when searching for an operand
    switch (I->getOpcode()) {
    case Instruction::Alloca:
        // we need alloca's as target to DefSites
        return {createAlloc(I)};
    case Instruction::Store:
        return {createStore(I)};
    case Instruction::AtomicRMW:
        return {createAtomicRMW(I)};
    case Instruction::Load:
        if (buildUses) {
            return {createLoad(I)};
        }
        break;
    case Instruction::Ret:
        // we need create returns, since
        // these modify CFG and thus data-flow
        return {createReturn(I)};
    case Instruction::Call:
        if (!isRelevantCall(I, _options))
            break;

        return createCall(I);
    }

    return {};
}